

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.hpp
# Opt level: O0

int cfgfile::format_t<int,_cfgfile::wstring_trait_t>::from_string
              (parser_info_t<cfgfile::wstring_trait_t> *info,string_t *value)

{
  long lVar1;
  long lVar2;
  undefined8 uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  parser_info_t<cfgfile::wstring_trait_t> *in_RDI;
  exception *anon_var_0;
  int result;
  size_t pos;
  size_t *in_stack_fffffffffffffb48;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
  *in_stack_fffffffffffffb50;
  string_t *in_stack_fffffffffffffb58;
  exception_t<cfgfile::wstring_trait_t> *in_stack_fffffffffffffb60;
  string *in_stack_fffffffffffffb78;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
  *in_stack_fffffffffffffb80;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
  *in_stack_fffffffffffffb88;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb90;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_229 [16];
  int local_1c;
  long local_18;
  parser_info_t<cfgfile::wstring_trait_t> *local_8;
  
  local_18 = 0;
  local_8 = in_RDI;
  local_1c = std::__cxx11::stoi(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,0);
  lVar1 = local_18;
  lVar2 = std::__cxx11::wstring::length();
  if (lVar1 != lVar2) {
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffb90,(char *)in_stack_fffffffffffffb88,
               (allocator<char> *)in_stack_fffffffffffffb80);
    wstring_trait_t::from_ascii(in_stack_fffffffffffffb78);
    std::operator+(in_stack_fffffffffffffb58,in_stack_fffffffffffffb50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffb90,(char *)in_stack_fffffffffffffb88,
               (allocator<char> *)in_stack_fffffffffffffb80);
    wstring_trait_t::from_ascii(in_stack_fffffffffffffb78);
    std::operator+(in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
    parser_info_t<cfgfile::wstring_trait_t>::file_name_abi_cxx11_(local_8);
    std::operator+(in_stack_fffffffffffffb58,in_stack_fffffffffffffb50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffb90,(char *)in_stack_fffffffffffffb88,
               (allocator<char> *)in_stack_fffffffffffffb80);
    wstring_trait_t::from_ascii(in_stack_fffffffffffffb78);
    std::operator+(in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
    this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           parser_info_t<cfgfile::wstring_trait_t>::line_number(local_8);
    wstring_trait_t::to_string_abi_cxx11_((pos_t)in_stack_fffffffffffffb48);
    std::operator+(in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
    __lhs = local_229;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,(char *)__lhs,(allocator<char> *)in_stack_fffffffffffffb80);
    wstring_trait_t::from_ascii(in_stack_fffffffffffffb78);
    std::operator+(__lhs,in_stack_fffffffffffffb80);
    exception_t<cfgfile::wstring_trait_t>::exception_t
              (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
    __cxa_throw(uVar3,&exception_t<cfgfile::wstring_trait_t>::typeinfo,
                exception_t<cfgfile::wstring_trait_t>::~exception_t);
  }
  return local_1c;
}

Assistant:

static int from_string( const parser_info_t< wstring_trait_t > & info,
		const wstring_trait_t::string_t & value )
	{
		try {
			std::size_t pos = 0;

			int result = std::stoi( value, &pos );

			if( pos != value.length() )
				throw exception_t< wstring_trait_t >(
					wstring_trait_t::from_ascii( "Invalid value: \"" ) +
					value + wstring_trait_t::from_ascii( "\". In file \"" ) +
					info.file_name() +
					wstring_trait_t::from_ascii( "\" on line " ) +
					wstring_trait_t::to_string( info.line_number() ) +
					wstring_trait_t::from_ascii( "." ) );

			return result;
		}
		catch( const std::exception & )
		{
			throw exception_t< wstring_trait_t >(
				wstring_trait_t::from_ascii( "Invalid value: \"" ) +
				value + wstring_trait_t::from_ascii( "\". In file \"" ) +
				info.file_name() +
				wstring_trait_t::from_ascii( "\" on line " ) +
				wstring_trait_t::to_string( info.line_number() ) +
				wstring_trait_t::from_ascii( "." ) );
		}
	}